

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain
          (InterfaceVariableScalarReplacement *this,Instruction *access_chain,
          Instruction *base_access_chain)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Operand *pOVar3;
  uint32_t i;
  uint32_t index;
  OperandList new_operands;
  
  if ((base_access_chain->opcode_ == OpAccessChain) && (access_chain->opcode_ == OpAccessChain)) {
    index = 0;
    uVar1 = Instruction::GetSingleWordInOperand(access_chain,0);
    uVar2 = Instruction::result_id(base_access_chain);
    if (uVar1 == uVar2) {
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        uVar1 = Instruction::NumInOperands(base_access_chain);
        if (uVar1 <= index) break;
        pOVar3 = Instruction::GetInOperand(base_access_chain,index);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &new_operands,pOVar3);
        index = index + 1;
      }
      uVar1 = 1;
      while( true ) {
        uVar2 = Instruction::NumInOperands(access_chain);
        if (uVar2 <= uVar1) break;
        pOVar3 = Instruction::GetInOperand(access_chain,uVar1);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &new_operands,pOVar3);
        uVar1 = uVar1 + 1;
      }
      Instruction::SetInOperands(access_chain,&new_operands);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&new_operands);
      return;
    }
  }
  __assert_fail("base_access_chain->opcode() == spv::Op::OpAccessChain && access_chain->opcode() == spv::Op::OpAccessChain && access_chain->GetSingleWordInOperand(0) == base_access_chain->result_id()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x1c3,
                "void spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(Instruction *, Instruction *)"
               );
}

Assistant:

void InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(
    Instruction* access_chain, Instruction* base_access_chain) {
  assert(base_access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->GetSingleWordInOperand(0) ==
             base_access_chain->result_id());
  Instruction::OperandList new_operands;
  for (uint32_t i = 0; i < base_access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(base_access_chain->GetInOperand(i));
  }
  for (uint32_t i = 1; i < access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(access_chain->GetInOperand(i));
  }
  access_chain->SetInOperands(std::move(new_operands));
}